

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_store_sr_ppc64(CPUPPCState_conflict2 *env,target_ulong srnum,target_ulong value)

{
  if ((env->mmu_model & 0x10000) == POWERPC_MMU_UNKNOWN) {
    if (env->sr[srnum] != value) {
      env->sr[srnum] = value;
      *(byte *)&env->tlb_need_flush = (byte)env->tlb_need_flush | 1;
    }
    return;
  }
  ppc_store_slb((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write,srnum,
                (ulong)(uint)((int)srnum << 0x1c) | 0x8000000,
                (ulong)((uint)value >> 0x13 & 0xf00) | (ulong)((uint)value & 0xfffffff) << 0xc);
  return;
}

Assistant:

void helper_store_sr(CPUPPCState *env, target_ulong srnum, target_ulong value)
{
#if 0
    qemu_log_mask(CPU_LOG_MMU,
            "%s: reg=%d " TARGET_FMT_lx " " TARGET_FMT_lx "\n", __func__,
            (int)srnum, value, env->sr[srnum]);
#endif
#if defined(TARGET_PPC64)
    if (env->mmu_model & POWERPC_MMU_64) {
        PowerPCCPU *cpu = env_archcpu(env);
        uint64_t esid, vsid;

        /* ESID = srnum */
        esid = ((uint64_t)(srnum & 0xf) << 28) | SLB_ESID_V;

        /* VSID = VSID */
        vsid = (value & 0xfffffff) << 12;
        /* flags = flags */
        vsid |= ((value >> 27) & 0xf) << 8;

        ppc_store_slb(cpu, srnum, esid, vsid);
    } else
#endif
    if (env->sr[srnum] != value) {
        env->sr[srnum] = value;
        /*
         * Invalidating 256MB of virtual memory in 4kB pages is way
         * longer than flusing the whole TLB.
         */
#if !defined(FLUSH_ALL_TLBS) && 0
        {
            target_ulong page, end;
            /* Invalidate 256 MB of virtual memory */
            page = (16 << 20) * srnum;
            end = page + (16 << 20);
            for (; page != end; page += TARGET_PAGE_SIZE) {
                tlb_flush_page(env_cpu(env), page);
            }
        }
#else
        env->tlb_need_flush |= TLB_NEED_LOCAL_FLUSH;
#endif
    }
}